

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glSetVertexAttribDivisor(MOJOSHADER_usage usage,int index,uint divisor)

{
  GLuint GVar1;
  GLint gl_index;
  uint divisor_local;
  int index_local;
  MOJOSHADER_usage usage_local;
  
  if (ctx->have_GL_ARB_instanced_arrays == 0) {
    __assert_fail("ctx->have_GL_ARB_instanced_arrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0x933,
                  "void MOJOSHADER_glSetVertexAttribDivisor(MOJOSHADER_usage, int, unsigned int)");
  }
  if ((((ctx->bound_program != (MOJOSHADER_glProgram *)0x0) &&
       (ctx->bound_program->vertex != (MOJOSHADER_glShader *)0x0)) &&
      (GVar1 = ctx->bound_program->vertex_attrib_loc[usage][index], GVar1 != 0xffffffff)) &&
     (divisor != ctx->attr_divisor[(int)GVar1])) {
    (*ctx->glVertexAttribDivisorARB)(GVar1,divisor);
    ctx->attr_divisor[(int)GVar1] = divisor;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetVertexAttribDivisor(MOJOSHADER_usage usage,
                                         int index, unsigned int divisor)
{
    assert(ctx->have_GL_ARB_instanced_arrays);

    if ((ctx->bound_program == NULL) || (ctx->bound_program->vertex == NULL))
        return;

    const GLint gl_index = ctx->bound_program->vertex_attrib_loc[usage][index];

    if (gl_index == -1)
        return; // Nothing to do, this shader doesn't use this stream.

    if (divisor != ctx->attr_divisor[gl_index])
    {
        ctx->glVertexAttribDivisorARB(gl_index, divisor);
        ctx->attr_divisor[gl_index] = divisor;
    } // if
}